

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::assemble::COOMatrix<double>::makeDense
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,COOMatrix<double> *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  uint *puVar4;
  ostream *poVar5;
  int *piVar6;
  double *pdVar7;
  Scalar *pSVar8;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [376];
  Triplet<double,_int> *local_50;
  Triplet *trp;
  const_iterator __end0;
  const_iterator __begin0;
  TripletVec *__range3;
  COOMatrix<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *mat;
  
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&this->rows_,&this->cols_);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__);
  __end0 = std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
           begin(&this->triplets_);
  trp = (Triplet *)
        std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::end
                  (&this->triplets_);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                      (&__end0,(__normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)&trp);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return __return_storage_ptr__;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
               ::operator*(&__end0);
    puVar4 = (uint *)Eigen::Triplet<double,_int>::col(local_50);
    if ((this->cols_ <= *puVar4) ||
       (puVar4 = (uint *)Eigen::Triplet<double,_int>::row(local_50), this->rows_ <= *puVar4)) break;
    pdVar7 = Eigen::Triplet<double,_int>::value(local_50);
    dVar1 = *pdVar7;
    piVar6 = Eigen::Triplet<double,_int>::row(local_50);
    iVar2 = *piVar6;
    piVar6 = Eigen::Triplet<double,_int>::col(local_50);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,(long)iVar2,(long)*piVar6);
    *pSVar8 = dVar1 + *pSVar8;
    __gnu_cxx::
    __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
    ::operator++(&__end0);
  }
  std::__cxx11::stringstream::stringstream(local_1d8);
  poVar5 = std::operator<<(local_1c8,"Illegal triplet index (");
  piVar6 = Eigen::Triplet<double,_int>::col(local_50);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  poVar5 = std::operator<<(poVar5,',');
  piVar6 = Eigen::Triplet<double,_int>::row(local_50);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  std::operator<<(poVar5,")");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"((trp.col() < cols_) && (trp.row() < rows_))",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,&local_221);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1f8,&local_220,0xc2,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"false",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
  lf::base::AssertionFailed(&local_268,&local_290,0xc2,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<Scalar, Eigen::Dynamic, Eigen::Dynamic>
  makeDense() const {
    Eigen::Matrix<Scalar, Eigen::Dynamic, Eigen::Dynamic> mat(rows_, cols_);
    mat.setZero();
    for (const Triplet &trp : triplets_) {
      LF_ASSERT_MSG(
          ((trp.col() < cols_) && (trp.row() < rows_)),
          "Illegal triplet index (" << trp.col() << ',' << trp.row() << ")");
      mat(trp.row(), trp.col()) += trp.value();
    }
    return mat;
  }